

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int mbedtls_asn1_get_alg(uchar **p,uchar *end,mbedtls_asn1_buf *alg,mbedtls_asn1_buf *params)

{
  byte *end_00;
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  size_t in_RAX;
  byte *pbVar4;
  long lVar5;
  size_t len;
  size_t local_28;
  
  puVar1 = *p;
  local_28 = in_RAX;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
    iVar3 = -0x60;
  }
  else {
    iVar3 = -0x62;
    if (*puVar1 == '0') {
      *p = puVar1 + 1;
      iVar3 = mbedtls_asn1_get_len(p,end,&local_28);
    }
  }
  if (iVar3 == 0) {
    pbVar4 = *p;
    if (end == pbVar4 || (long)end - (long)pbVar4 < 0) {
      iVar3 = -0x60;
    }
    else {
      alg->tag = (uint)*pbVar4;
      end_00 = pbVar4 + local_28;
      if ((long)local_28 < 1) {
        iVar3 = -0x60;
      }
      else {
        iVar3 = -0x62;
        if (*pbVar4 == 6) {
          *p = pbVar4 + 1;
          iVar3 = mbedtls_asn1_get_len(p,end_00,&alg->len);
        }
      }
      if (iVar3 == 0) {
        alg->p = *p;
        pbVar4 = *p + alg->len;
        *p = pbVar4;
        if (pbVar4 == end_00) {
          iVar3 = 0;
          lVar5 = 0;
          do {
            *(undefined1 *)((long)&params->tag + lVar5) = 0;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x18);
        }
        else {
          params->tag = (uint)*pbVar4;
          *p = pbVar4 + 1;
          iVar3 = mbedtls_asn1_get_len(p,end_00,&params->len);
          if (iVar3 == 0) {
            params->p = *p;
            puVar1 = *p;
            sVar2 = params->len;
            *p = puVar1 + sVar2;
            iVar3 = -0x66;
            if (puVar1 + sVar2 == end_00) {
              iVar3 = 0;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_get_alg( unsigned char **p,
                  const unsigned char *end,
                  mbedtls_asn1_buf *alg, mbedtls_asn1_buf *params )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    alg->tag = **p;
    end = *p + len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &alg->len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( ret );

    alg->p = *p;
    *p += alg->len;

    if( *p == end )
    {
        mbedtls_zeroize( params, sizeof(mbedtls_asn1_buf) );
        return( 0 );
    }

    params->tag = **p;
    (*p)++;

    if( ( ret = mbedtls_asn1_get_len( p, end, &params->len ) ) != 0 )
        return( ret );

    params->p = *p;
    *p += params->len;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}